

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O0

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  AnsiUdpPortListSyntax *pAVar1;
  SeparatedSyntaxList<slang::syntax::UdpPortDeclSyntax> *unaff_retaddr;
  Token *in_stack_00000008;
  BumpAllocator *in_stack_00000010;
  BumpAllocator *in_stack_000000f8;
  SeparatedSyntaxList<slang::syntax::UdpPortDeclSyntax> *in_stack_00000100;
  
  parsing::Token::deepClone((Token *)in_stack_00000100,in_stack_000000f8);
  deepClone<slang::syntax::UdpPortDeclSyntax>(in_stack_00000100,in_stack_000000f8);
  parsing::Token::deepClone((Token *)in_stack_00000100,in_stack_000000f8);
  parsing::Token::deepClone((Token *)in_stack_00000100,in_stack_000000f8);
  pAVar1 = BumpAllocator::
           emplace<slang::syntax::AnsiUdpPortListSyntax,slang::parsing::Token,slang::syntax::SeparatedSyntaxList<slang::syntax::UdpPortDeclSyntax>&,slang::parsing::Token,slang::parsing::Token>
                     (in_stack_00000010,in_stack_00000008,unaff_retaddr,(Token *)__fn,
                      (Token *)__child_stack);
  return (int)pAVar1;
}

Assistant:

static SyntaxNode* clone(const AnsiUdpPortListSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<AnsiUdpPortListSyntax>(
        node.openParen.deepClone(alloc),
        *deepClone(node.ports, alloc),
        node.closeParen.deepClone(alloc),
        node.semi.deepClone(alloc)
    );
}